

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

TestCaseGroup * vkt::memory::createPipelineBarrierTests(TestContext *testCtx)

{
  char *__s;
  pointer pcVar1;
  size_t sVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  string usageGroupName;
  string testName;
  ostringstream s;
  undefined1 auStack_218 [8];
  TestNode *local_210;
  TestContext *local_208;
  long *local_200 [2];
  long local_1f0 [2];
  long *local_1e0;
  long local_1d0 [2];
  uint local_1c0;
  uint local_1bc;
  long local_1b8;
  long local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_210 = (TestNode *)operator_new(0x70);
  local_208 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_210,testCtx,"pipeline_barrier","Pipeline barrier tests.");
  lVar7 = 0;
  do {
    local_1bc = (&DAT_00b2be50)[lVar7];
    lVar6 = 0;
    local_1b8 = lVar7;
    do {
      local_1c0 = (&DAT_00b28020)[lVar6] | local_1bc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      bVar5 = true;
      lVar7 = 0;
      local_1b0 = lVar6;
      do {
        if ((*(uint *)((long)&DAT_00d27810 + lVar7) & local_1c0) != 0) {
          if (bVar5) {
            bVar5 = false;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
          }
          __s = *(char **)((long)&PTR_anon_var_dwarf_e1dd9f_00d27818 + lVar7);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_218 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x70);
          }
          else {
            sVar2 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
          }
        }
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x100);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pTVar3 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar3,local_208,(char *)local_200[0],(char *)local_200[0]);
      lVar7 = 0;
      do {
        pcVar1 = *(pointer *)((long)&DAT_00b2be30 + lVar7);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pTVar4 = (TestNode *)operator_new(0x90);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar4,local_208,NODETYPE_SELF_VALIDATE,(char *)local_1e0,
                   (char *)local_1e0);
        pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d27920;
        *(uint *)&pTVar4[1].m_testCtx = local_1c0;
        pTVar4[1].m_name._M_dataplus._M_p = pcVar1;
        *(undefined4 *)&pTVar4[1].m_name._M_string_length = 0;
        tcu::TestNode::addChild(pTVar3,pTVar4);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x20);
      tcu::TestNode::addChild(local_210,pTVar3);
      if (local_200[0] != local_1f0) {
        operator_delete(local_200[0],local_1f0[0] + 1);
      }
      lVar6 = local_1b0 + 1;
    } while (lVar6 != 10);
    lVar7 = local_1b8 + 1;
  } while (local_1b8 == 0);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"all","");
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,local_208,(char *)local_200[0],(char *)local_200[0]);
  lVar7 = 0;
  do {
    pcVar1 = *(pointer *)((long)&DAT_00b2be30 + lVar7);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar4 = (TestNode *)operator_new(0x90);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,local_208,NODETYPE_SELF_VALIDATE,(char *)local_1e0,
               (char *)local_1e0);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d27920;
    *(undefined4 *)&pTVar4[1].m_testCtx = 0x1bff;
    pTVar4[1].m_name._M_dataplus._M_p = pcVar1;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 0;
    tcu::TestNode::addChild(pTVar3,pTVar4);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x20);
  tcu::TestNode::addChild(local_210,pTVar3);
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"all_device","");
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,local_208,(char *)local_200[0],(char *)local_200[0]);
  lVar7 = 0;
  do {
    pcVar1 = *(pointer *)((long)&DAT_00b2be30 + lVar7);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pTVar4 = (TestNode *)operator_new(0x90);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar4,local_208,NODETYPE_SELF_VALIDATE,(char *)local_1e0,
               (char *)local_1e0);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d27920;
    *(undefined4 *)&pTVar4[1].m_testCtx = 0x1bfc;
    pTVar4[1].m_name._M_dataplus._M_p = pcVar1;
    *(undefined4 *)&pTVar4[1].m_name._M_string_length = 0;
    tcu::TestNode::addChild(pTVar3,pTVar4);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x20);
  tcu::TestNode::addChild(local_210,pTVar3);
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  return (TestCaseGroup *)local_210;
}

Assistant:

tcu::TestCaseGroup* createPipelineBarrierTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "pipeline_barrier", "Pipeline barrier tests."));
	const vk::VkDeviceSize			sizes[]			=
	{
		1024,		// 1K
		8*1024,		// 8K
		64*1024,	// 64K
		1024*1024,	// 1M
	};
	const Usage						usages[]		=
	{
		USAGE_HOST_READ,
		USAGE_HOST_WRITE,
		USAGE_TRANSFER_SRC,
		USAGE_TRANSFER_DST,
		USAGE_VERTEX_BUFFER,
		USAGE_INDEX_BUFFER,
		USAGE_UNIFORM_BUFFER,
		USAGE_UNIFORM_TEXEL_BUFFER,
		USAGE_STORAGE_BUFFER,
		USAGE_STORAGE_TEXEL_BUFFER,
		USAGE_STORAGE_IMAGE,
		USAGE_SAMPLED_IMAGE
	};
	const Usage						readUsages[]		=
	{
		USAGE_HOST_READ,
		USAGE_TRANSFER_SRC,
		USAGE_VERTEX_BUFFER,
		USAGE_INDEX_BUFFER,
		USAGE_UNIFORM_BUFFER,
		USAGE_UNIFORM_TEXEL_BUFFER,
		USAGE_STORAGE_BUFFER,
		USAGE_STORAGE_TEXEL_BUFFER,
		USAGE_STORAGE_IMAGE,
		USAGE_SAMPLED_IMAGE
	};

	const Usage						writeUsages[]	=
	{
		USAGE_HOST_WRITE,
		USAGE_TRANSFER_DST
	};

	for (size_t writeUsageNdx = 0; writeUsageNdx < DE_LENGTH_OF_ARRAY(writeUsages); writeUsageNdx++)
	{
		const Usage	writeUsage	= writeUsages[writeUsageNdx];

		for (size_t readUsageNdx = 0; readUsageNdx < DE_LENGTH_OF_ARRAY(readUsages); readUsageNdx++)
		{
			const Usage						readUsage		= readUsages[readUsageNdx];
			const Usage						usage			= writeUsage | readUsage;
			const string					usageGroupName	(usageToName(usage));
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					usage,
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}
	}

	{
		Usage all = (Usage)0;

		for (size_t usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
			all = all | usages[usageNdx];

		{
			const string					usageGroupName	("all");
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					all,
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}

		{
			const string					usageGroupName	("all_device");
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					(Usage)(all & (~(USAGE_HOST_READ|USAGE_HOST_WRITE))),
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}
	}

	return group.release();
}